

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

int sexp_param_index(sexp ctx,sexp lambda,sexp name)

{
  int iVar1;
  sexp psVar2;
  sexp *ppsVar3;
  
  while( true ) {
    iVar1 = 0;
    psVar2 = lambda;
    while ((psVar2 = (psVar2->value).type.cpl, ((ulong)psVar2 & 3) == 0 && (psVar2->tag == 6))) {
      if ((psVar2->value).type.name == name) {
        return iVar1;
      }
      iVar1 = iVar1 + 1;
    }
    if (psVar2 == name) {
      return iVar1;
    }
    iVar1 = -5;
    ppsVar3 = &(lambda->value).type.setters;
    while ((psVar2 = *ppsVar3, ((ulong)psVar2 & 3) == 0 && (psVar2->tag == 6))) {
      if ((psVar2->value).type.name == name) {
        return iVar1;
      }
      iVar1 = iVar1 + -1;
      ppsVar3 = &(psVar2->value).type.cpl;
    }
    if ((((ulong)name & 3) != 0) || (name->tag != 0x16)) break;
    name = (name->value).type.slots;
  }
  sexp_warn(ctx,"can\'t happen: no argument: ",name);
  return -10000;
}

Assistant:

int sexp_param_index (sexp ctx, sexp lambda, sexp name) {
  sexp ls;
  int i;
  while (1) {
    ls = sexp_lambda_params(lambda);
    for (i=0; sexp_pairp(ls); ls=sexp_cdr(ls), i++)
      if (sexp_car(ls) == name)
        return i;
    if (ls == name)
      return i;
    ls = sexp_lambda_locals(lambda);
    for (i=-1; sexp_pairp(ls); ls=sexp_cdr(ls), i--)
      if (sexp_car(ls) == name)
        return i-4;
    if (sexp_synclop(name))
      name = sexp_synclo_expr(name);
    else
      break;
  }
  sexp_warn(ctx, "can't happen: no argument: ", name);
  return -10000;
}